

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void PairSearchHelper(ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
                     ON_RTreePairSearchCallbackResult *a_result)

{
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON__INT_PTR *pOVar4;
  
  iVar1 = a_nodeA->m_count;
  if (0 < (long)iVar1) {
    paVar3 = &a_nodeA->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        ((ON_RTreeBBox *)(paVar3 + -6),&a_branchB->m_rect,a_result->m_tolerance);
      if (bVar2) {
        if (a_nodeA->m_level < 1) {
          (*a_result->m_resultCallback)
                    (a_result->m_context,(ON__INT_PTR)paVar3->m_child,
                     (ON__INT_PTR)(a_branchB->field_1).m_child);
        }
        else {
          PairSearchHelper(paVar3->m_child,a_branchB,a_result);
        }
      }
      pOVar4 = (ON__INT_PTR *)(paVar3 + 1);
      paVar3 = paVar3 + 7;
    } while (pOVar4 < a_nodeA->m_branch + iVar1);
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  while(branchA < branchAmax)
  {
    if ( PairSearchOverlapHelper( &branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeA->m_level > 0 )
      {
        PairSearchHelper(branchA->m_child,a_branchB,a_result);
      }
      else
      {
        a_result->m_resultCallback(a_result->m_context,branchA->m_id,a_branchB->m_id);
      }
    }
    branchA++;
  }
}